

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O2

void __thiscall DynamicGraph::updateRelatives(DynamicGraph *this)

{
  pointer psVar1;
  pointer psVar2;
  pointer puVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  AdjList *cg;
  pointer this_00;
  pointer psVar6;
  Vertex v;
  ulong uVar7;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> local_48;
  
  uVar7 = 0;
  do {
    if ((ulong)((long)(this->level).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->level).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar7) {
      return;
    }
    psVar1 = (this->super_UndirectedGraph).super_type.m_vertices.
             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = *(pointer *)
              ((long)&psVar1[uVar7].super_StoredVertex.m_out_edges.
                      super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
              + 8);
    for (psVar6 = *(pointer *)
                   &psVar1[uVar7].super_StoredVertex.m_out_edges.
                    super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
        ; psVar6 != psVar2; psVar6 = psVar6 + 1) {
      local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
           (psVar6->super_stored_edge<unsigned_long>).m_target;
      puVar3 = (this->level).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = puVar3[uVar7];
      uVar5 = puVar3[local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target];
      if (uVar4 == uVar5 + 1) {
        this_00 = (this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar7;
LAB_0010a800:
        local_48.m_eproperty = (psVar6->m_iter)._M_node + 2;
        local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = uVar7;
        std::
        _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
        ::_M_insert_unique<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>
                  ((_Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::less<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
                    *)this_00,&local_48);
      }
      else {
        if (uVar4 == uVar5) {
          this_00 = (pointer)&(this->relatives).
                              super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar7].b_sibl;
          goto LAB_0010a800;
        }
        if (uVar4 == uVar5 - 1) {
          this_00 = (pointer)&(this->relatives).
                              super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar7].c_succ;
          goto LAB_0010a800;
        }
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void DynamicGraph::updateRelatives()
{
    for(Vertex v = 0; v < this->level.size(); v++) {
        OutEdgeIterator ei, ei_end;
        for(boost::tie(ei, ei_end) = out_edges(v, *this); ei != ei_end; ++ei) {
            Vertex u = target(*ei, *this);
            if(this->level[v] == this->level[u] + 1 ) {
                this->relatives[v].a_pred.insert(*ei);
            }
            else if(this->level[v] == this->level[u]) {
                this->relatives[v].b_sibl.insert(*ei);
            }
            else if(this->level[v] == this->level[u] - 1 ) {
                this->relatives[v].c_succ.insert(*ei);
            }
        }
    }
}